

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::parse_www_authenticate
               (Response *res,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *auth,bool is_proxy)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *__re;
  difference_type dVar4;
  byte in_DL;
  undefined8 in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  value_type m;
  sregex_iterator i;
  sregex_iterator beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  size_type pos;
  string s;
  char *auth_key;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffffd38;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  Response *in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  string *this;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *this_00;
  match_flag_type __m;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *this_01;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd0;
  string local_218 [64];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_198;
  undefined8 local_158;
  undefined8 local_148;
  string local_f8 [36];
  int local_d4;
  string local_d0 [32];
  long local_b0;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [55];
  undefined1 local_49 [33];
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *local_28;
  byte local_19;
  byte local_1;
  
  __m = (match_flag_type)((ulong)in_RDI >> 0x20);
  local_19 = in_DL & 1;
  __re = "WWW-Authenticate";
  if (local_19 != 0) {
    __re = "Proxy-Authenticate";
  }
  this_01 = (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             *)local_49;
  local_28 = (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)__re;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,
             (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
             (allocator<char> *)in_stack_fffffffffffffd70);
  bVar1 = Response::has_header(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  if (bVar1) {
    if ((parse_www_authenticate(httplib::Response_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,bool)
         ::re_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&parse_www_authenticate(httplib::Response_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,bool)
                                     ::re_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffd80,
                 (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                 (flag_type)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse_www_authenticate(httplib::Response_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,bool)
                    ::re_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse_www_authenticate(httplib::Response_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,bool)
                           ::re_abi_cxx11_);
    }
    this_00 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,
               (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               (allocator<char> *)in_stack_fffffffffffffd70);
    Response::get_header_value
              ((Response *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    local_b0 = std::__cxx11::string::find((char)local_80,0x20);
    if (local_b0 == -1) {
LAB_001249b3:
      local_d4 = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_d0,(ulong)local_80);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      if (bVar1) {
        local_1 = 0;
        local_d4 = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_f8,(ulong)local_80);
          this = local_f8;
          std::__cxx11::string::operator=(local_80,this);
          std::__cxx11::string::~string(this);
          local_148 = std::__cxx11::string::begin();
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    (&in_stack_fffffffffffffd40->_M_begin,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd38);
          local_158 = std::__cxx11::string::end();
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    (&in_stack_fffffffffffffd40->_M_begin,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd38);
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::regex_iterator(this_01,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           (regex_type *)__re,__m);
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::regex_iterator(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          while( true ) {
            local_1a8 = 0;
            uStack_1a0 = 0;
            local_1b8 = 0;
            uStack_1b0 = 0;
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_1d8 = 0;
            uStack_1d0 = 0;
            std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::regex_iterator(in_stack_fffffffffffffd40);
            bVar2 = std::__cxx11::
                    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    ::operator!=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
            std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                               *)0x1246bb);
            if ((bVar2 & 1) == 0) break;
            std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator*(&local_198);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffd40,
                            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffd38);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
            std::__cxx11::string::substr((ulong)local_218,(ulong)local_80);
            dVar4 = std::__cxx11::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
            if (dVar4 < 1) {
              in_stack_fffffffffffffd48 =
                   (string *)
                   std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
              in_stack_fffffffffffffd40 =
                   (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)std::__cxx11::
                      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
              std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdc8,(ulong)local_80);
            }
            else {
              std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
              in_stack_fffffffffffffd50 =
                   (Response *)
                   std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
              std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdc8,(ulong)local_80);
            }
            in_stack_fffffffffffffd38 =
                 (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)this,(key_type *)CONCAT17(bVar2,in_stack_fffffffffffffd78));
            std::__cxx11::string::operator=
                      ((string *)in_stack_fffffffffffffd38,(string *)&stack0xfffffffffffffdc8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
            std::__cxx11::string::~string(local_218);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)0x1248c0);
            std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator++(this_00);
          }
          local_d4 = 2;
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                             *)0x1246db);
          local_1 = 1;
          local_d4 = 1;
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                             *)0x12496a);
        }
        else {
          local_d4 = 0;
        }
      }
      std::__cxx11::string::~string(local_d0);
      if (local_d4 == 0) goto LAB_001249b3;
    }
    std::__cxx11::string::~string(local_80);
    if (local_d4 != 0) goto LAB_001249f3;
  }
  local_1 = 0;
LAB_001249f3:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool parse_www_authenticate(const Response& res,
            std::map<std::string, std::string>& auth,
            bool is_proxy) {
            auto auth_key = is_proxy ? "Proxy-Authenticate" : "WWW-Authenticate";
            if (res.has_header(auth_key)) {
                static auto re = std::regex(R"~((?:(?:,\s*)?(.+?)=(?:"(.*?)"|([^,]*))))~");
                auto s = res.get_header_value(auth_key);
                auto pos = s.find(' ');
                if (pos != std::string::npos) {
                    auto type = s.substr(0, pos);
                    if (type == "Basic") {
                        return false;
                    } else if (type == "Digest") {
                        s = s.substr(pos + 1);
                        auto beg = std::sregex_iterator(s.begin(), s.end(), re);
                        for (auto i = beg; i != std::sregex_iterator(); ++i) {
                            auto m = *i;
                            auto key = s.substr(static_cast<size_t>(m.position(1)),
                                static_cast<size_t>(m.length(1)));
                            auto val = m.length(2) > 0
                                ? s.substr(static_cast<size_t>(m.position(2)),
                                    static_cast<size_t>(m.length(2)))
                                : s.substr(static_cast<size_t>(m.position(3)),
                                    static_cast<size_t>(m.length(3)));
                            auth[key] = val;
                        }
                        return true;
                    }
                }
            }
            return false;
        }